

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O3

void * array_realloc(int elem,void *base,int *cur,int cnt)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  
  iVar1 = *cur + 1;
  do {
    iVar1 = iVar1 * 2;
  } while (iVar1 < cnt);
  uVar3 = iVar1 * elem;
  if (0xfe0 < uVar3) {
    iVar1 = (int)((elem + uVar3 + 0x101f & 0xfffff000) - 0x20) / elem;
    uVar3 = iVar1 * elem;
  }
  *cur = iVar1;
  pvVar2 = ev_realloc(base,(long)(int)uVar3);
  return pvVar2;
}

Assistant:

ecb_cold
array_realloc (int elem, void *base, int *cur, int cnt)
{
  *cur = array_nextsize (elem, *cur, cnt);
  return ev_realloc (base, elem * *cur);
}